

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

UniValue * __thiscall
wallet::DescribeWalletAddressVisitor::operator()
          (DescribeWalletAddressVisitor *this,WitnessV0KeyHash *id)

{
  long *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *obj;
  CPubKey pubkey;
  UniValue *in_stack_fffffffffffffe58;
  CPubKey *other;
  undefined7 in_stack_fffffffffffffe68;
  byte in_stack_fffffffffffffe6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  WitnessV0KeyHash *key_hash;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  byte bVar1;
  UniValue *val;
  UniValue *this_00;
  UniValue *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  Span<const_unsigned_char> in_stack_fffffffffffffee0;
  undefined1 local_7d [20];
  undefined1 local_69 [65];
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (UniValue *)&stack0xffffffffffffffd8;
  val = in_RDI;
  std::__cxx11::string::string(in_stack_fffffffffffffe70);
  UniValue::UniValue((UniValue *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                     (VType)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                     (string *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe58);
  CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffe58);
  bVar1 = 0;
  if (*in_RSI != 0) {
    key_hash = (WitnessV0KeyHash *)*in_RSI;
    ToKeyID(key_hash);
    in_stack_fffffffffffffe6f =
         (**(code **)(*(long *)(key_hash->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.
                               m_data._M_elems + 0x20))(key_hash,local_7d,local_69);
    bVar1 = in_stack_fffffffffffffe6f;
  }
  if ((bVar1 & 1) != 0) {
    other = (CPubKey *)&stack0xfffffffffffffee7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
               (allocator<char> *)this_00);
    Span<const_unsigned_char>::Span<CPubKey>
              ((Span<const_unsigned_char> *)
               CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),other,
               in_stack_fffffffffffffe58);
    HexStr_abi_cxx11_(in_stack_fffffffffffffee0);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
    UniValue::pushKV(in_stack_fffffffffffffea0,(string *)this_00,val);
    UniValue::~UniValue(in_stack_fffffffffffffe58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe58);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe58);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const WitnessV0KeyHash& id) const
    {
        UniValue obj(UniValue::VOBJ);
        CPubKey pubkey;
        if (provider && provider->GetPubKey(ToKeyID(id), pubkey)) {
            obj.pushKV("pubkey", HexStr(pubkey));
        }
        return obj;
    }